

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constant.cpp
# Opt level: O3

bool duckdb::Transformer::ConstructConstantFromExpression(ParsedExpression *expr,Value *value)

{
  string *psVar1;
  ExpressionType EVar2;
  pointer puVar3;
  pointer pcVar4;
  element_type **ppeVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  element_type *peVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  FunctionExpression *pFVar13;
  ConstantExpression *pCVar14;
  CastExpression *pCVar15;
  pointer pPVar16;
  const_reference pvVar17;
  type pPVar18;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar19;
  LogicalType *pLVar20;
  LogicalType *value_type;
  BinderException *this;
  ConversionException *this_00;
  Value *child_value_1;
  pointer puVar21;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar22;
  Value keys;
  child_list_t<Value> values_2;
  Value values;
  vector<duckdb::Value,_true> values_unpacked;
  vector<duckdb::Value,_true> keys_unpacked;
  Value local_258;
  undefined1 local_218 [64];
  Value local_1d8;
  vector<duckdb::Value,_true> local_198;
  vector<duckdb::Value,_true> local_180;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_168;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_150;
  LogicalType local_138;
  vector<duckdb::Value,_true> local_120;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  LogicalType local_60;
  LogicalType local_48;
  
  EVar2 = (expr->super_BaseExpression).type;
  if (EVar2 == OPERATOR_CAST) {
    pCVar15 = BaseExpression::Cast<duckdb::CastExpression>(&expr->super_BaseExpression);
    LogicalType::LogicalType(&local_f0,SQLNULL);
    Value::Value(&local_258,&local_f0);
    LogicalType::~LogicalType(&local_f0);
    pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pCVar15->child);
    bVar11 = ConstructConstantFromExpression(pPVar18,&local_258);
    if (bVar11) {
      ppeVar5 = (element_type **)
                &local_1d8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_1d8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1d8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_1d8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      local_1d8.type_._0_8_ = ppeVar5;
      bVar10 = Value::DefaultTryCastAs
                         (&local_258,&pCVar15->cast_type,value,(string *)&local_1d8,false);
      if (!bVar10) {
        this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
        local_218._0_8_ = local_218 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_218,"Unable to cast %s to %s","");
        Value::ToString_abi_cxx11_(&local_80,&local_258);
        EnumUtil::ToString<duckdb::LogicalTypeId>(&local_a0,(pCVar15->cast_type).id_);
        ConversionException::ConversionException<std::__cxx11::string,std::__cxx11::string>
                  (this_00,(string *)local_218,&local_80,&local_a0);
        __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((element_type **)local_1d8.type_._0_8_ != ppeVar5) {
        operator_delete((void *)local_1d8.type_._0_8_);
      }
    }
LAB_017822ae:
    Value::~Value(&local_258);
  }
  else {
    if (EVar2 == VALUE_CONSTANT) {
      pCVar14 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
      Value::operator=(value,&pCVar14->value);
      return true;
    }
    if (EVar2 == FUNCTION) {
      pFVar13 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
      psVar1 = &pFVar13->function_name;
      iVar12 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar12 == 0) {
        local_1d8.type_._0_8_ = &local_1d8.value_info_;
        local_1d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_00000001;
        local_1d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1d8._24_8_ = 0;
        local_1d8.value_.integer = 0x3f800000;
        local_1d8.value_.hugeint.upper = 0;
        local_1d8.value_info_.internal.
        super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_218._0_8_ = (pointer)0x0;
        local_218._8_8_ = (pointer)0x0;
        local_218._16_8_ = (pointer)0x0;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)local_218,
                  (long)(pFVar13->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pFVar13->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar21 = (pFVar13->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pFVar13->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar21 != puVar3) {
          do {
            pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar21);
            local_258.type_._0_8_ =
                 (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_1d8;
            pVar22 = ::std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)&local_1d8,&(pPVar16->super_BaseExpression).alias,&local_258);
            if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              this = (BinderException *)__cxa_allocate_exception(0x10);
              local_258.type_._0_8_ =
                   &local_258.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_258,"Duplicate struct entry name \"%s\"","");
              pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(puVar21);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              pcVar4 = (pPVar16->super_BaseExpression).alias._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,pcVar4,
                         pcVar4 + (pPVar16->super_BaseExpression).alias._M_string_length);
              BinderException::BinderException<std::__cxx11::string>
                        (this,(string *)&local_258,&local_c0);
              __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            LogicalType::LogicalType(&local_48,SQLNULL);
            Value::Value(&local_258,&local_48);
            LogicalType::~LogicalType(&local_48);
            pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(puVar21);
            bVar11 = ConstructConstantFromExpression(pPVar18,&local_258);
            if (!bVar11) {
              Value::~Value(&local_258);
              bVar11 = false;
              goto LAB_01782776;
            }
            pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar21);
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
            ::emplace_back<std::__cxx11::string_const&,duckdb::Value>
                      ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                        *)local_218,&(pPVar16->super_BaseExpression).alias,&local_258);
            Value::~Value(&local_258);
            puVar21 = puVar21 + 1;
          } while (puVar21 != puVar3);
        }
        local_108.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_218._0_8_;
        local_108.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_218._8_8_;
        local_108.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_218._16_8_;
        local_218._0_8_ = (pointer)0x0;
        local_218._8_8_ = (pointer)0x0;
        local_218._16_8_ = (pointer)0x0;
        Value::STRUCT(&local_258,(child_list_t<Value> *)&local_108);
        Value::operator=(value,&local_258);
        Value::~Value(&local_258);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector(&local_108);
        bVar11 = true;
LAB_01782776:
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)local_218);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&local_1d8);
        return bVar11;
      }
      iVar12 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar12 == 0) {
        local_1d8.type_._0_8_ = (LogicalType *)0x0;
        local_1d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8,
                   (long)(pFVar13->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pFVar13->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar21 = (pFVar13->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pFVar13->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar21 != puVar3) {
          do {
            LogicalType::LogicalType(&local_60,SQLNULL);
            Value::Value(&local_258,&local_60);
            LogicalType::~LogicalType(&local_60);
            pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(puVar21);
            bVar11 = ConstructConstantFromExpression(pPVar18,&local_258);
            if (!bVar11) {
              Value::~Value(&local_258);
              bVar11 = false;
              goto LAB_0178279b;
            }
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8,
                       &local_258);
            Value::~Value(&local_258);
            puVar21 = puVar21 + 1;
          } while (puVar21 != puVar3);
        }
        LogicalType::LogicalType((LogicalType *)local_218,SQLNULL);
        peVar9 = local_1d8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((element_type *)local_1d8.type_._0_8_ !=
            local_1d8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          pLVar20 = (LogicalType *)local_1d8.type_._0_8_;
          do {
            LogicalType::ForceMaxLogicalType(&local_258.type_,(LogicalType *)local_218,pLVar20);
            uVar8 = local_218._16_8_;
            uVar7 = local_218._8_8_;
            uVar6 = local_258.type_._0_8_;
            local_218[0] = local_258.type_.id_;
            local_218[1] = local_258.type_.physical_type_;
            local_218._8_8_ =
                 local_258.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_218._16_8_ =
                 local_258.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            local_258.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar7;
            local_258.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
            local_258.type_._0_8_ = uVar6;
            LogicalType::~LogicalType(&local_258.type_);
            pLVar20 = (LogicalType *)((long)(pLVar20 + 2) + 0x10);
          } while ((element_type *)pLVar20 != peVar9);
        }
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120,
                   (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8);
        Value::LIST(&local_258,(LogicalType *)local_218,&local_120);
        Value::operator=(value,&local_258);
        Value::~Value(&local_258);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120);
        LogicalType::~LogicalType((LogicalType *)local_218);
        bVar11 = true;
LAB_0178279b:
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8);
        return bVar11;
      }
      iVar12 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar12 == 0) {
        LogicalType::LogicalType(&local_d8,SQLNULL);
        Value::Value(&local_258,&local_d8);
        LogicalType::~LogicalType(&local_d8);
        pvVar17 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[](&pFVar13->children,0);
        pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar17);
        bVar11 = ConstructConstantFromExpression(pPVar18,&local_258);
        if (bVar11) {
          LogicalType::LogicalType(&local_138,SQLNULL);
          Value::Value(&local_1d8,&local_138);
          LogicalType::~LogicalType(&local_138);
          pvVar17 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](&pFVar13->children,1);
          pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(pvVar17);
          bVar11 = ConstructConstantFromExpression(pPVar18,&local_1d8);
          if (bVar11) {
            pvVar19 = &ListValue::GetChildren(&local_258)->
                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_150,pvVar19);
            pvVar19 = &ListValue::GetChildren(&local_1d8)->
                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168,pvVar19);
            pLVar20 = ListType::GetChildType(&local_258.type_);
            value_type = ListType::GetChildType(&local_1d8.type_);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_180,
                       &local_150);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_198,
                       &local_168);
            Value::MAP((Value *)local_218,pLVar20,value_type,&local_180,&local_198);
            Value::operator=(value,(Value *)local_218);
            Value::~Value((Value *)local_218);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_198);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_180);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_150);
          }
          Value::~Value(&local_1d8);
        }
        else {
          bVar11 = false;
        }
        goto LAB_017822ae;
      }
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Transformer::ConstructConstantFromExpression(const ParsedExpression &expr, Value &value) {
	// We have to construct it like this because we don't have the ClientContext for binding/executing the expr here
	switch (expr.GetExpressionType()) {
	case ExpressionType::FUNCTION: {
		auto &function = expr.Cast<FunctionExpression>();
		if (function.function_name == "struct_pack") {
			unordered_set<string> unique_names;
			child_list_t<Value> values;
			values.reserve(function.children.size());
			for (const auto &child : function.children) {
				if (!unique_names.insert(child->GetAlias()).second) {
					throw BinderException("Duplicate struct entry name \"%s\"", child->GetAlias());
				}
				Value child_value;
				if (!ConstructConstantFromExpression(*child, child_value)) {
					return false;
				}
				values.emplace_back(child->GetAlias(), std::move(child_value));
			}
			value = Value::STRUCT(std::move(values));
			return true;
		} else if (function.function_name == "list_value") {
			vector<Value> values;
			values.reserve(function.children.size());
			for (const auto &child : function.children) {
				Value child_value;
				if (!ConstructConstantFromExpression(*child, child_value)) {
					return false;
				}
				values.emplace_back(std::move(child_value));
			}

			// figure out child type
			LogicalType child_type(LogicalTypeId::SQLNULL);
			for (auto &child_value : values) {
				child_type = LogicalType::ForceMaxLogicalType(child_type, child_value.type());
			}

			// finally create the list
			value = Value::LIST(child_type, values);
			return true;
		} else if (function.function_name == "map") {
			Value keys;
			if (!ConstructConstantFromExpression(*function.children[0], keys)) {
				return false;
			}

			Value values;
			if (!ConstructConstantFromExpression(*function.children[1], values)) {
				return false;
			}

			vector<Value> keys_unpacked = ListValue::GetChildren(keys);
			vector<Value> values_unpacked = ListValue::GetChildren(values);

			value = Value::MAP(ListType::GetChildType(keys.type()), ListType::GetChildType(values.type()),
			                   keys_unpacked, values_unpacked);
			return true;
		} else {
			return false;
		}
	}
	case ExpressionType::VALUE_CONSTANT: {
		auto &constant = expr.Cast<ConstantExpression>();
		value = constant.value;
		return true;
	}
	case ExpressionType::OPERATOR_CAST: {
		auto &cast = expr.Cast<CastExpression>();
		Value dummy_value;
		if (!ConstructConstantFromExpression(*cast.child, dummy_value)) {
			return false;
		}

		string error_message;
		if (!dummy_value.DefaultTryCastAs(cast.cast_type, value, &error_message)) {
			throw ConversionException("Unable to cast %s to %s", dummy_value.ToString(),
			                          EnumUtil::ToString(cast.cast_type.id()));
		}
		return true;
	}
	default:
		return false;
	}
}